

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  GridSOA *pGVar3;
  float *pfVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  GridSOA *pGVar9;
  Geometry *pGVar10;
  GridSOA *pGVar11;
  RTCFilterFunctionN p_Var12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar19;
  uint uVar20;
  long lVar21;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar22;
  ulong uVar23;
  RTCRayN *pRVar24;
  int iVar25;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar26;
  ulong uVar27;
  GridSOA *pGVar28;
  long lVar29;
  GridSOA *pGVar30;
  undefined4 uVar31;
  ulong uVar32;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  float fVar42;
  float fVar71;
  float fVar72;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar73;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar68;
  undefined1 auVar69 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar70;
  uint uVar74;
  undefined1 auVar76 [12];
  undefined1 auVar77 [12];
  uint uVar90;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar75;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar94 [12];
  undefined1 auVar95 [12];
  float fVar105;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar99;
  undefined1 auVar100 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint uVar111;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar137;
  undefined1 auVar136 [16];
  float fVar138;
  float fVar139;
  float fVar144;
  float fVar146;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar170;
  float fVar171;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar178;
  float fVar186;
  float fVar187;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar192 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  undefined4 uStack_12dc;
  undefined8 local_12c8;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_1298;
  undefined8 local_1288;
  vbool<4> valid;
  undefined1 local_1268 [16];
  Precalculations *local_1258;
  GridSOA *local_1250;
  ulong local_1248;
  ulong local_1240;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  undefined8 local_1228;
  float fStack_1220;
  float fStack_121c;
  RTCFilterFunctionNArguments args;
  undefined4 uStack_11dc;
  vfloat<4> tNear;
  float local_1178 [4];
  float local_1168 [4];
  undefined1 local_1158 [8];
  float fStack_1150;
  float fStack_114c;
  undefined1 local_1148 [16];
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [8];
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined1 local_10d8 [16];
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined4 local_10b8;
  undefined4 uStack_10b4;
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  undefined1 local_1078 [16];
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  uint local_1038;
  uint uStack_1034;
  uint uStack_1030;
  uint uStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar118 [16];
  undefined1 auVar123 [16];
  undefined1 auVar179 [16];
  
  pSVar33 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_fb8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_fc8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_fd8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_fe8 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_ff8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1008 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1028 = local_fe8 * 0.99999964;
  local_10c8 = local_ff8 * 0.99999964;
  local_1018 = local_1008 * 0.99999964;
  local_fe8 = local_fe8 * 1.0000004;
  local_ff8 = local_ff8 * 1.0000004;
  local_1008 = local_1008 * 1.0000004;
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar25 = (tray->tnear).field_0.i[k];
  local_10d8._4_4_ = iVar25;
  local_10d8._0_4_ = iVar25;
  local_10d8._8_4_ = iVar25;
  local_10d8._12_4_ = iVar25;
  iVar25 = (tray->tfar).field_0.i[k];
  auVar180._4_4_ = iVar25;
  auVar180._0_4_ = iVar25;
  auVar180._8_4_ = iVar25;
  auVar180._12_4_ = iVar25;
  lVar21 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_10c4 = local_10c8;
  fStack_10c0 = local_10c8;
  fStack_10bc = local_10c8;
  auVar100 = local_10d8;
  fVar144 = local_fb8;
  fVar72 = local_fb8;
  fVar148 = local_fb8;
  fVar73 = local_fb8;
  fVar105 = local_ff8;
  fVar154 = local_ff8;
  fVar155 = local_ff8;
  fVar109 = local_ff8;
  fVar161 = local_1018;
  fVar190 = local_1018;
  fVar191 = local_1018;
  fVar167 = local_1018;
  fVar137 = local_1028;
  fVar93 = local_1028;
  fVar92 = local_1028;
  fVar187 = local_1028;
  fVar42 = local_10c8;
  fVar71 = local_10c8;
  fVar91 = local_10c8;
  fVar106 = local_10c8;
  fVar107 = local_fc8;
  fVar108 = local_fc8;
  fVar110 = local_fc8;
  fVar138 = local_fc8;
  fVar139 = local_fd8;
  fVar145 = local_fd8;
  fVar146 = local_fd8;
  fVar147 = local_fd8;
  fVar149 = local_fe8;
  fVar152 = local_fe8;
  fVar153 = local_fe8;
  fVar156 = local_fe8;
  fVar157 = local_1008;
  fVar158 = local_1008;
  fVar162 = local_1008;
  fVar163 = local_1008;
  local_1258 = pre;
LAB_00726bcd:
  do {
    do {
      if (pSVar33 == stack) {
        return;
      }
      pSVar22 = pSVar33 + -1;
      pSVar33 = pSVar33 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar22->dist &&
             (float)pSVar22->dist != *(float *)(ray + k * 4 + 0x80));
    pSVar22 = stack;
    pSVar26 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar33->ptr).ptr;
    while (((ulong)pSVar26 & 8) == 0) {
      pfVar4 = (float *)((long)&pSVar26[2].ptr.ptr + uVar35);
      auVar43._0_4_ = (*pfVar4 - fVar144) * fVar137;
      auVar43._4_4_ = (pfVar4[1] - fVar72) * fVar93;
      auVar43._8_4_ = (pfVar4[2] - fVar148) * fVar92;
      auVar43._12_4_ = (pfVar4[3] - fVar73) * fVar187;
      pfVar4 = (float *)((long)&pSVar26[2].ptr.ptr + uVar32);
      auVar131._0_4_ = (*pfVar4 - fVar107) * fVar42;
      auVar131._4_4_ = (pfVar4[1] - fVar108) * fVar71;
      auVar131._8_4_ = (pfVar4[2] - fVar110) * fVar91;
      auVar131._12_4_ = (pfVar4[3] - fVar138) * fVar106;
      auVar43 = maxps(auVar43,auVar131);
      pfVar4 = (float *)((long)&pSVar26[2].ptr.ptr + uVar36);
      auVar141._0_4_ = (*pfVar4 - fVar139) * fVar161;
      auVar141._4_4_ = (pfVar4[1] - fVar145) * fVar190;
      auVar141._8_4_ = (pfVar4[2] - fVar146) * fVar191;
      auVar141._12_4_ = (pfVar4[3] - fVar147) * fVar167;
      auVar96 = maxps(auVar141,auVar100);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar43,auVar96);
      pfVar4 = (float *)((long)&pSVar26[2].ptr.ptr + (uVar35 ^ 0x10));
      auVar97._0_4_ = (*pfVar4 - fVar144) * fVar149;
      auVar97._4_4_ = (pfVar4[1] - fVar72) * fVar152;
      auVar97._8_4_ = (pfVar4[2] - fVar148) * fVar153;
      auVar97._12_4_ = (pfVar4[3] - fVar73) * fVar156;
      pfVar4 = (float *)((long)&pSVar26[2].ptr.ptr + (uVar32 ^ 0x10));
      auVar112._0_4_ = (*pfVar4 - fVar107) * fVar105;
      auVar112._4_4_ = (pfVar4[1] - fVar108) * fVar154;
      auVar112._8_4_ = (pfVar4[2] - fVar110) * fVar155;
      auVar112._12_4_ = (pfVar4[3] - fVar138) * fVar109;
      auVar43 = minps(auVar97,auVar112);
      pfVar4 = (float *)((long)&pSVar26[2].ptr.ptr + (uVar36 ^ 0x10));
      auVar113._0_4_ = (*pfVar4 - fVar139) * fVar157;
      auVar113._4_4_ = (pfVar4[1] - fVar145) * fVar158;
      auVar113._8_4_ = (pfVar4[2] - fVar146) * fVar162;
      auVar113._12_4_ = (pfVar4[3] - fVar147) * fVar163;
      auVar96 = minps(auVar113,auVar180);
      auVar43 = minps(auVar43,auVar96);
      auVar96._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar43._4_4_);
      auVar96._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar43._0_4_);
      auVar96._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar43._8_4_);
      auVar96._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar43._12_4_);
      uVar20 = movmskps((int)pSVar22,auVar96);
      if (uVar20 == 0) goto LAB_00726bcd;
      uVar20 = uVar20 & 0xff;
      uVar27 = (ulong)pSVar26 & 0xfffffffffffffff0;
      lVar34 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
        }
      }
      pSVar22 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar27 + lVar34 * 8);
      uVar20 = uVar20 - 1 & uVar20;
      pSVar26 = pSVar22;
      if (uVar20 != 0) {
        uVar74 = tNear.field_0.i[lVar34];
        lVar34 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
          }
        }
        pSVar26 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar27 + lVar34 * 8);
        uVar75 = tNear.field_0.i[lVar34];
        uVar20 = uVar20 - 1 & uVar20;
        if (uVar20 == 0) {
          if (uVar74 < uVar75) {
            (pSVar33->ptr).ptr = (size_t)pSVar26;
            pSVar33->dist = uVar75;
            pSVar26 = pSVar22;
            pSVar33 = pSVar33 + 1;
          }
          else {
            (pSVar33->ptr).ptr = (size_t)pSVar22;
            pSVar33->dist = uVar74;
            pSVar22 = pSVar26;
            pSVar33 = pSVar33 + 1;
          }
        }
        else {
          auVar98._8_4_ = uVar74;
          auVar98._0_8_ = pSVar22;
          auVar98._12_4_ = 0;
          auVar127._8_4_ = uVar75;
          auVar127._0_8_ = pSVar26;
          auVar127._12_4_ = 0;
          lVar34 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
            }
          }
          uVar8 = *(undefined8 *)(uVar27 + lVar34 * 8);
          iVar25 = tNear.field_0.i[lVar34];
          auVar114._8_4_ = iVar25;
          auVar114._0_8_ = uVar8;
          auVar114._12_4_ = 0;
          auVar44._8_4_ = -(uint)((int)uVar74 < (int)uVar75);
          uVar20 = uVar20 - 1 & uVar20;
          if (uVar20 == 0) {
            auVar44._4_4_ = auVar44._8_4_;
            auVar44._0_4_ = auVar44._8_4_;
            auVar44._12_4_ = auVar44._8_4_;
            auVar130._8_4_ = uVar75;
            auVar130._0_8_ = pSVar26;
            auVar130._12_4_ = 0;
            auVar131 = blendvps(auVar130,auVar98,auVar44);
            auVar43 = blendvps(auVar98,auVar127,auVar44);
            auVar45._8_4_ = -(uint)(auVar131._8_4_ < iVar25);
            auVar45._4_4_ = auVar45._8_4_;
            auVar45._0_4_ = auVar45._8_4_;
            auVar45._12_4_ = auVar45._8_4_;
            auVar128._8_4_ = iVar25;
            auVar128._0_8_ = uVar8;
            auVar128._12_4_ = 0;
            auVar96 = blendvps(auVar128,auVar131,auVar45);
            auVar131 = blendvps(auVar131,auVar114,auVar45);
            auVar46._8_4_ = -(uint)(auVar43._8_4_ < auVar131._8_4_);
            auVar46._4_4_ = auVar46._8_4_;
            auVar46._0_4_ = auVar46._8_4_;
            auVar46._12_4_ = auVar46._8_4_;
            SVar115 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar131,auVar43,auVar46);
            SVar99 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar43,auVar131,auVar46);
            *pSVar33 = SVar99;
            pSVar33[1] = SVar115;
            pSVar22 = auVar96._0_8_;
            pSVar33 = pSVar33 + 2;
            pSVar26 = pSVar22;
          }
          else {
            lVar34 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
              }
            }
            auVar100._4_4_ = auVar44._8_4_;
            auVar100._0_4_ = auVar44._8_4_;
            auVar100._8_4_ = auVar44._8_4_;
            auVar100._12_4_ = auVar44._8_4_;
            auVar131 = blendvps(auVar127,auVar98,auVar100);
            auVar100 = blendvps(auVar98,auVar127,auVar100);
            auVar140._8_4_ = tNear.field_0.i[lVar34];
            auVar140._0_8_ = *(undefined8 *)(uVar27 + lVar34 * 8);
            auVar140._12_4_ = 0;
            auVar47._8_4_ = -(uint)(iVar25 < tNear.field_0.i[lVar34]);
            auVar47._4_4_ = auVar47._8_4_;
            auVar47._0_4_ = auVar47._8_4_;
            auVar47._12_4_ = auVar47._8_4_;
            auVar96 = blendvps(auVar140,auVar114,auVar47);
            auVar43 = blendvps(auVar114,auVar140,auVar47);
            auVar48._8_4_ = -(uint)(auVar100._8_4_ < auVar43._8_4_);
            auVar48._4_4_ = auVar48._8_4_;
            auVar48._0_4_ = auVar48._8_4_;
            auVar48._12_4_ = auVar48._8_4_;
            auVar141 = blendvps(auVar43,auVar100,auVar48);
            SVar99 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar100,auVar43,auVar48);
            auVar49._8_4_ = -(uint)(auVar131._8_4_ < auVar96._8_4_);
            auVar49._4_4_ = auVar49._8_4_;
            auVar49._0_4_ = auVar49._8_4_;
            auVar49._12_4_ = auVar49._8_4_;
            auVar100 = blendvps(auVar96,auVar131,auVar49);
            auVar43 = blendvps(auVar131,auVar96,auVar49);
            auVar50._8_4_ = -(uint)(auVar43._8_4_ < auVar141._8_4_);
            auVar50._4_4_ = auVar50._8_4_;
            auVar50._0_4_ = auVar50._8_4_;
            auVar50._12_4_ = auVar50._8_4_;
            SVar115 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar141,auVar43,auVar50);
            SVar132 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar43,auVar141,auVar50);
            *pSVar33 = SVar99;
            pSVar33[1] = SVar132;
            pSVar33[2] = SVar115;
            pSVar22 = auVar100._0_8_;
            pSVar33 = pSVar33 + 3;
            pSVar26 = pSVar22;
            auVar100 = local_10d8;
            fVar42 = local_10c8;
            fVar71 = fStack_10c4;
            fVar91 = fStack_10c0;
            fVar106 = fStack_10bc;
          }
        }
      }
    }
    if (((uint)pSVar26 & 0xf) == 8) {
      pGVar9 = (local_1258->super_Precalculations).grid;
      uVar27 = (ulong)*(uint *)(pGVar9 + 0xc);
      lVar34 = ((ulong)pSVar26 >> 4) * 4 + (ulong)*(uint *)(pGVar9 + 0x24);
      pGVar30 = pGVar9 + ((ulong)pSVar26 >> 4) * 4 + (ulong)*(uint *)(pGVar9 + 0x24) + 0x2c;
      fVar144 = *(float *)(pGVar30 + 4);
      pGVar28 = pGVar9 + uVar27 * 4 + lVar34 + 0x2c;
      fVar72 = *(float *)(pGVar28 + 4);
      fVar148 = *(float *)(pGVar30 + 8);
      fVar73 = *(float *)(pGVar28 + 8);
      if (uVar27 == 2) {
        fVar148 = fVar144;
        fVar73 = fVar72;
      }
      uVar23 = (ulong)*(uint *)(pGVar9 + 0x14);
      lVar29 = uVar23 * 4 + lVar34;
      fVar105 = *(float *)(pGVar9 + lVar29 + 0x30);
      pGVar1 = pGVar9 + lVar29 + 0x2c + uVar27 * 4;
      fVar154 = *(float *)(pGVar1 + 4);
      fVar155 = *(float *)(pGVar1 + 8);
      fVar109 = *(float *)(pGVar9 + lVar29 + 0x34);
      if (uVar27 == 2) {
        fVar155 = fVar154;
        fVar109 = fVar105;
      }
      lVar19 = uVar23 * 8 + lVar34;
      fVar161 = *(float *)(pGVar9 + lVar19 + 0x30);
      pGVar11 = pGVar9 + lVar19 + 0x2c + uVar27 * 4;
      fVar190 = *(float *)(pGVar11 + 4);
      fVar191 = *(float *)(pGVar11 + 8);
      fVar167 = *(float *)(pGVar9 + lVar19 + 0x34);
      if (uVar27 == 2) {
        fVar191 = fVar190;
        fVar167 = fVar161;
      }
      uVar20 = *(uint *)(pGVar9 + 0x10);
      local_1250 = pGVar9 + uVar23 * 0xc + lVar34 + 0x2c;
      fVar137 = *(float *)(ray + k * 4);
      fVar93 = *(float *)(ray + k * 4 + 0x10);
      fVar92 = *(float *)(ray + k * 4 + 0x20);
      fVar187 = *(float *)(ray + k * 4 + 0x40);
      fVar201 = *(float *)pGVar30 - fVar137;
      fVar202 = *(float *)pGVar28 - fVar137;
      fVar204 = fVar144 - fVar137;
      fVar206 = fVar72 - fVar137;
      local_10e8 = *(float *)(pGVar9 + lVar29 + 0x2c) - fVar93;
      fStack_10e4 = *(float *)pGVar1 - fVar93;
      fStack_10e0 = fVar105 - fVar93;
      fStack_10dc = fVar154 - fVar93;
      fVar193 = *(float *)(pGVar9 + lVar19 + 0x2c) - fVar92;
      fVar195 = *(float *)pGVar11 - fVar92;
      fVar197 = fVar161 - fVar92;
      fVar199 = fVar190 - fVar92;
      fVar138 = fVar144 - fVar137;
      fVar144 = fVar144 - fVar137;
      fVar146 = fVar148 - fVar137;
      fVar148 = fVar148 - fVar137;
      fVar91 = fVar105 - fVar93;
      fVar105 = fVar105 - fVar93;
      fVar107 = fVar109 - fVar93;
      fVar109 = fVar109 - fVar93;
      fVar156 = fVar161 - fVar92;
      fVar161 = fVar161 - fVar92;
      fVar164 = fVar167 - fVar92;
      fVar167 = fVar167 - fVar92;
      fVar42 = *(float *)pGVar28 - fVar137;
      fVar71 = fVar72 - fVar137;
      fVar72 = fVar72 - fVar137;
      fVar73 = fVar73 - fVar137;
      fVar152 = *(float *)pGVar1 - fVar93;
      fVar153 = fVar154 - fVar93;
      fVar154 = fVar154 - fVar93;
      fVar155 = fVar155 - fVar93;
      fVar188 = *(float *)pGVar11 - fVar92;
      fVar189 = fVar190 - fVar92;
      fVar190 = fVar190 - fVar92;
      fVar191 = fVar191 - fVar92;
      fVar157 = fVar42 - fVar201;
      fVar162 = fVar71 - fVar202;
      fVar165 = fVar72 - fVar204;
      fVar168 = fVar73 - fVar206;
      fVar92 = fVar152 - local_10e8;
      fVar106 = fVar153 - fStack_10e4;
      fVar108 = fVar154 - fStack_10e0;
      fVar110 = fVar155 - fStack_10dc;
      fVar170 = fVar188 - fVar193;
      fVar174 = fVar189 - fVar195;
      fStack_1220 = fVar190 - fVar197;
      fStack_121c = fVar191 - fVar199;
      fVar137 = *(float *)(ray + k * 4 + 0x50);
      fVar93 = *(float *)(ray + k * 4 + 0x60);
      fVar158 = fVar201 - fVar138;
      fVar163 = fVar202 - fVar144;
      fVar166 = fVar204 - fVar146;
      fVar169 = fVar206 - fVar148;
      fVar178 = (fVar92 * (fVar188 + fVar193) - (fVar152 + local_10e8) * fVar170) * fVar187 +
                ((fVar42 + fVar201) * fVar170 - (fVar188 + fVar193) * fVar157) * fVar137 +
                (fVar157 * (fVar152 + local_10e8) - (fVar42 + fVar201) * fVar92) * fVar93;
      fVar186 = (fVar106 * (fVar189 + fVar195) - (fVar153 + fStack_10e4) * fVar174) * fVar187 +
                ((fVar71 + fVar202) * fVar174 - (fVar189 + fVar195) * fVar162) * fVar137 +
                (fVar162 * (fVar153 + fStack_10e4) - (fVar71 + fVar202) * fVar106) * fVar93;
      auVar179._0_8_ = CONCAT44(fVar186,fVar178);
      auVar179._8_4_ =
           (fVar108 * (fVar190 + fVar197) - (fVar154 + fStack_10e0) * fStack_1220) * fVar187 +
           ((fVar72 + fVar204) * fStack_1220 - (fVar190 + fVar197) * fVar165) * fVar137 +
           (fVar165 * (fVar154 + fStack_10e0) - (fVar72 + fVar204) * fVar108) * fVar93;
      auVar179._12_4_ =
           (fVar110 * (fVar191 + fVar199) - (fVar155 + fStack_10dc) * fStack_121c) * fVar187 +
           ((fVar73 + fVar206) * fStack_121c - (fVar191 + fVar199) * fVar168) * fVar137 +
           (fVar168 * (fVar155 + fStack_10dc) - (fVar73 + fVar206) * fVar110) * fVar93;
      fVar171 = local_10e8 - fVar91;
      fVar175 = fStack_10e4 - fVar105;
      fVar176 = fStack_10e0 - fVar107;
      fVar177 = fStack_10dc - fVar109;
      local_10f8._0_4_ = fVar193 - fVar156;
      local_10f8._4_4_ = fVar195 - fVar161;
      fStack_10f0 = fVar197 - fVar164;
      fStack_10ec = fVar199 - fVar167;
      auVar133._0_4_ =
           (fVar171 * (fVar193 + fVar156) - (local_10e8 + fVar91) * (float)local_10f8._0_4_) *
           fVar187 + ((fVar201 + fVar138) * (float)local_10f8._0_4_ - (fVar193 + fVar156) * fVar158)
                     * fVar137 +
                     (fVar158 * (local_10e8 + fVar91) - (fVar201 + fVar138) * fVar171) * fVar93;
      auVar133._4_4_ =
           (fVar175 * (fVar195 + fVar161) - (fStack_10e4 + fVar105) * (float)local_10f8._4_4_) *
           fVar187 + ((fVar202 + fVar144) * (float)local_10f8._4_4_ - (fVar195 + fVar161) * fVar163)
                     * fVar137 +
                     (fVar163 * (fStack_10e4 + fVar105) - (fVar202 + fVar144) * fVar175) * fVar93;
      auVar133._8_4_ =
           (fVar176 * (fVar197 + fVar164) - (fStack_10e0 + fVar107) * fStack_10f0) * fVar187 +
           ((fVar204 + fVar146) * fStack_10f0 - (fVar197 + fVar164) * fVar166) * fVar137 +
           (fVar166 * (fStack_10e0 + fVar107) - (fVar204 + fVar146) * fVar176) * fVar93;
      auVar133._12_4_ =
           (fVar177 * (fVar199 + fVar167) - (fStack_10dc + fVar109) * fStack_10ec) * fVar187 +
           ((fVar206 + fVar148) * fStack_10ec - (fVar199 + fVar167) * fVar169) * fVar137 +
           (fVar169 * (fStack_10dc + fVar109) - (fVar206 + fVar148) * fVar177) * fVar93;
      fVar139 = fVar138 - fVar42;
      fVar145 = fVar144 - fVar71;
      fVar147 = fVar146 - fVar72;
      fVar149 = fVar148 - fVar73;
      fVar194 = fVar91 - fVar152;
      fVar196 = fVar105 - fVar153;
      fVar198 = fVar107 - fVar154;
      fVar200 = fVar109 - fVar155;
      local_1108 = fVar156 - fVar188;
      fStack_1104 = fVar161 - fVar189;
      fStack_1100 = fVar164 - fVar190;
      fStack_10fc = fVar167 - fVar191;
      auVar78._0_4_ =
           (fVar194 * (fVar188 + fVar156) - (fVar152 + fVar91) * local_1108) * fVar187 +
           ((fVar42 + fVar138) * local_1108 - (fVar188 + fVar156) * fVar139) * fVar137 +
           (fVar139 * (fVar152 + fVar91) - (fVar42 + fVar138) * fVar194) * fVar93;
      auVar78._4_4_ =
           (fVar196 * (fVar189 + fVar161) - (fVar153 + fVar105) * fStack_1104) * fVar187 +
           ((fVar71 + fVar144) * fStack_1104 - (fVar189 + fVar161) * fVar145) * fVar137 +
           (fVar145 * (fVar153 + fVar105) - (fVar71 + fVar144) * fVar196) * fVar93;
      auVar78._8_4_ =
           (fVar198 * (fVar190 + fVar164) - (fVar154 + fVar107) * fStack_1100) * fVar187 +
           ((fVar72 + fVar146) * fStack_1100 - (fVar190 + fVar164) * fVar147) * fVar137 +
           (fVar147 * (fVar154 + fVar107) - (fVar72 + fVar146) * fVar198) * fVar93;
      auVar78._12_4_ =
           (fVar200 * (fVar191 + fVar167) - (fVar155 + fVar109) * fStack_10fc) * fVar187 +
           ((fVar73 + fVar148) * fStack_10fc - (fVar191 + fVar167) * fVar149) * fVar137 +
           (fVar149 * (fVar155 + fVar109) - (fVar73 + fVar148) * fVar200) * fVar93;
      local_1118._0_4_ = fVar178 + auVar133._0_4_ + auVar78._0_4_;
      local_1118._4_4_ = fVar186 + auVar133._4_4_ + auVar78._4_4_;
      fStack_1110 = auVar179._8_4_ + auVar133._8_4_ + auVar78._8_4_;
      fStack_110c = auVar179._12_4_ + auVar133._12_4_ + auVar78._12_4_;
      auVar51._8_4_ = auVar179._8_4_;
      auVar51._0_8_ = auVar179._0_8_;
      auVar51._12_4_ = auVar179._12_4_;
      auVar100 = minps(auVar51,auVar133);
      auVar100 = minps(auVar100,auVar78);
      auVar180 = maxps(auVar179,auVar133);
      auVar180 = maxps(auVar180,auVar78);
      local_fa8 = ABS((float)local_1118._0_4_);
      fStack_fa4 = ABS((float)local_1118._4_4_);
      fStack_fa0 = ABS(fStack_1110);
      fStack_f9c = ABS(fStack_110c);
      auVar181._4_4_ = -(uint)(auVar180._4_4_ <= fStack_fa4 * 1.1920929e-07);
      auVar181._0_4_ = -(uint)(auVar180._0_4_ <= local_fa8 * 1.1920929e-07);
      auVar181._8_4_ = -(uint)(auVar180._8_4_ <= fStack_fa0 * 1.1920929e-07);
      auVar181._12_4_ = -(uint)(auVar180._12_4_ <= fStack_f9c * 1.1920929e-07);
      auVar52._4_4_ = -(uint)(-(fStack_fa4 * 1.1920929e-07) <= auVar100._4_4_);
      auVar52._0_4_ = -(uint)(-(local_fa8 * 1.1920929e-07) <= auVar100._0_4_);
      auVar52._8_4_ = -(uint)(-(fStack_fa0 * 1.1920929e-07) <= auVar100._8_4_);
      auVar52._12_4_ = -(uint)(-(fStack_f9c * 1.1920929e-07) <= auVar100._12_4_);
      auVar181 = auVar181 | auVar52;
      iVar25 = movmskps((int)local_1250,auVar181);
      if (iVar25 != 0) {
        local_f88 = auVar133;
        local_f98 = fVar194;
        fStack_f94 = fVar196;
        fStack_f90 = fVar198;
        fStack_f8c = fVar200;
        auVar134._0_4_ = fVar92 * (float)local_10f8._0_4_ - fVar171 * fVar170;
        auVar134._4_4_ = fVar106 * (float)local_10f8._4_4_ - fVar175 * fVar174;
        auVar134._8_4_ = fVar108 * fStack_10f0 - fVar176 * fStack_1220;
        auVar134._12_4_ = fVar110 * fStack_10ec - fVar177 * fStack_121c;
        auVar172._0_4_ = fVar171 * local_1108 - fVar194 * (float)local_10f8._0_4_;
        auVar172._4_4_ = fVar175 * fStack_1104 - fVar196 * (float)local_10f8._4_4_;
        auVar172._8_4_ = fVar176 * fStack_1100 - fVar198 * fStack_10f0;
        auVar172._12_4_ = fVar177 * fStack_10fc - fVar200 * fStack_10ec;
        auVar53._4_4_ = -(uint)(ABS(fVar175 * fVar174) < ABS(fVar196 * (float)local_10f8._4_4_));
        auVar53._0_4_ = -(uint)(ABS(fVar171 * fVar170) < ABS(fVar194 * (float)local_10f8._0_4_));
        auVar53._8_4_ = -(uint)(ABS(fVar176 * fStack_1220) < ABS(fVar198 * fStack_10f0));
        auVar53._12_4_ = -(uint)(ABS(fVar177 * fStack_121c) < ABS(fVar200 * fStack_10ec));
        local_1148 = blendvps(auVar172,auVar134,auVar53);
        auVar142._0_4_ = fVar139 * (float)local_10f8._0_4_ - fVar158 * local_1108;
        auVar142._4_4_ = fVar145 * (float)local_10f8._4_4_ - fVar163 * fStack_1104;
        auVar142._8_4_ = fVar147 * fStack_10f0 - fVar166 * fStack_1100;
        auVar142._12_4_ = fVar149 * fStack_10ec - fVar169 * fStack_10fc;
        auVar54._4_4_ = -(uint)(ABS(fVar162 * (float)local_10f8._4_4_) < ABS(fVar163 * fStack_1104))
        ;
        auVar54._0_4_ = -(uint)(ABS(fVar157 * (float)local_10f8._0_4_) < ABS(fVar158 * local_1108));
        auVar54._8_4_ = -(uint)(ABS(fVar165 * fStack_10f0) < ABS(fVar166 * fStack_1100));
        auVar54._12_4_ = -(uint)(ABS(fVar168 * fStack_10ec) < ABS(fVar169 * fStack_10fc));
        auVar17._4_4_ = fVar174 * fVar163 - fVar162 * (float)local_10f8._4_4_;
        auVar17._0_4_ = fVar170 * fVar158 - fVar157 * (float)local_10f8._0_4_;
        auVar17._8_4_ = fStack_1220 * fVar166 - fVar165 * fStack_10f0;
        auVar17._12_4_ = fStack_121c * fVar169 - fVar168 * fStack_10ec;
        local_1138 = blendvps(auVar142,auVar17,auVar54);
        auVar159._0_4_ = fVar158 * fVar194 - fVar139 * fVar171;
        auVar159._4_4_ = fVar163 * fVar196 - fVar145 * fVar175;
        auVar159._8_4_ = fVar166 * fVar198 - fVar147 * fVar176;
        auVar159._12_4_ = fVar169 * fVar200 - fVar149 * fVar177;
        auVar55._4_4_ = -(uint)(ABS(fVar163 * fVar106) < ABS(fVar145 * fVar175));
        auVar55._0_4_ = -(uint)(ABS(fVar158 * fVar92) < ABS(fVar139 * fVar171));
        auVar55._8_4_ = -(uint)(ABS(fVar166 * fVar108) < ABS(fVar147 * fVar176));
        auVar55._12_4_ = -(uint)(ABS(fVar169 * fVar110) < ABS(fVar149 * fVar177));
        auVar14._4_4_ = fVar162 * fVar175 - fVar163 * fVar106;
        auVar14._0_4_ = fVar157 * fVar171 - fVar158 * fVar92;
        auVar14._8_4_ = fVar165 * fVar176 - fVar166 * fVar108;
        auVar14._12_4_ = fVar168 * fVar177 - fVar169 * fVar110;
        local_1128 = blendvps(auVar159,auVar14,auVar55);
        fVar144 = fVar187 * local_1148._0_4_ +
                  fVar137 * local_1138._0_4_ + fVar93 * local_1128._0_4_;
        fVar72 = fVar187 * local_1148._4_4_ + fVar137 * local_1138._4_4_ + fVar93 * local_1128._4_4_
        ;
        fVar148 = fVar187 * local_1148._8_4_ +
                  fVar137 * local_1138._8_4_ + fVar93 * local_1128._8_4_;
        fVar73 = fVar187 * local_1148._12_4_ +
                 fVar137 * local_1138._12_4_ + fVar93 * local_1128._12_4_;
        auVar150._0_4_ = fVar144 + fVar144;
        auVar150._4_4_ = fVar72 + fVar72;
        auVar150._8_4_ = fVar148 + fVar148;
        auVar150._12_4_ = fVar73 + fVar73;
        auVar56._0_4_ = fVar193 * local_1128._0_4_;
        auVar56._4_4_ = fVar195 * local_1128._4_4_;
        auVar56._8_4_ = fVar197 * local_1128._8_4_;
        auVar56._12_4_ = fVar199 * local_1128._12_4_;
        fVar144 = fVar201 * local_1148._0_4_ + local_10e8 * local_1138._0_4_ + auVar56._0_4_;
        fVar72 = fVar202 * local_1148._4_4_ + fStack_10e4 * local_1138._4_4_ + auVar56._4_4_;
        fVar148 = fVar204 * local_1148._8_4_ + fStack_10e0 * local_1138._8_4_ + auVar56._8_4_;
        fVar73 = fVar206 * local_1148._12_4_ + fStack_10dc * local_1138._12_4_ + auVar56._12_4_;
        auVar116._0_4_ = fVar144 + fVar144;
        auVar116._4_4_ = fVar72 + fVar72;
        auVar116._8_4_ = fVar148 + fVar148;
        auVar116._12_4_ = fVar73 + fVar73;
        auVar100 = rcpps(auVar56,auVar150);
        fVar144 = auVar100._0_4_;
        fVar72 = auVar100._4_4_;
        fVar105 = auVar100._8_4_;
        fVar154 = auVar100._12_4_;
        fVar148 = ((1.0 - auVar150._0_4_ * fVar144) * fVar144 + fVar144) * auVar116._0_4_;
        fVar73 = ((1.0 - auVar150._4_4_ * fVar72) * fVar72 + fVar72) * auVar116._4_4_;
        fVar105 = ((1.0 - auVar150._8_4_ * fVar105) * fVar105 + fVar105) * auVar116._8_4_;
        fVar154 = ((1.0 - auVar150._12_4_ * fVar154) * fVar154 + fVar154) * auVar116._12_4_;
        fVar72 = *(float *)(ray + k * 4 + 0x80);
        fVar144 = *(float *)(ray + k * 4 + 0x30);
        auVar57._0_4_ = -(uint)(fVar148 <= fVar72 && fVar144 <= fVar148) & auVar181._0_4_;
        auVar57._4_4_ = -(uint)(fVar73 <= fVar72 && fVar144 <= fVar73) & auVar181._4_4_;
        auVar57._8_4_ = -(uint)(fVar105 <= fVar72 && fVar144 <= fVar105) & auVar181._8_4_;
        auVar57._12_4_ = -(uint)(fVar154 <= fVar72 && fVar144 <= fVar154) & auVar181._12_4_;
        iVar25 = movmskps(iVar25,auVar57);
        if (iVar25 != 0) {
          valid.field_0.i[0] = auVar57._0_4_ & -(uint)(auVar150._0_4_ != 0.0);
          valid.field_0.i[1] = auVar57._4_4_ & -(uint)(auVar150._4_4_ != 0.0);
          valid.field_0.i[2] = auVar57._8_4_ & -(uint)(auVar150._8_4_ != 0.0);
          valid.field_0.i[3] = auVar57._12_4_ & -(uint)(auVar150._12_4_ != 0.0);
          iVar25 = movmskps(iVar25,(undefined1  [16])valid.field_0);
          if (iVar25 != 0) {
            uStack_12b0._0_4_ = *(uint *)(pGVar9 + 0x18);
            uVar7 = *(undefined4 *)(pGVar9 + 0x1c);
            uStack_12f0 = auVar179._8_8_;
            tNear.field_0._8_8_ = uStack_12f0;
            tNear.field_0._0_8_ = auVar179._0_8_;
            local_1158._4_4_ = fVar73;
            local_1158._0_4_ = fVar148;
            fStack_1150 = fVar105;
            fStack_114c = fVar154;
            pGVar10 = (context->scene->geometries).items[(uint)uStack_12b0].ptr;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar100 = *(undefined1 (*) [16])local_1250;
              auVar94 = auVar100._0_12_;
              auVar180 = *(undefined1 (*) [16])(local_1250 + uVar27 * 4);
              auVar76 = auVar180._0_12_;
              if (uVar27 == 2) {
                auVar94._0_8_ = auVar100._0_8_;
                auVar94._8_4_ = auVar100._4_4_;
                auVar76._0_8_ = auVar180._0_8_;
                auVar76._8_4_ = auVar180._4_4_;
              }
              auVar100 = rcpps(auVar116,_local_1118);
              fVar144 = auVar100._0_4_;
              fVar155 = auVar100._4_4_;
              fVar109 = auVar100._8_4_;
              fVar161 = auVar100._12_4_;
              fVar144 = (float)(-(uint)(1e-18 <= local_fa8) &
                               (uint)(((float)DAT_01f46a60 - (float)local_1118._0_4_ * fVar144) *
                                      fVar144 + fVar144));
              fVar155 = (float)(-(uint)(1e-18 <= fStack_fa4) &
                               (uint)((DAT_01f46a60._4_4_ - (float)local_1118._4_4_ * fVar155) *
                                      fVar155 + fVar155));
              fVar109 = (float)(-(uint)(1e-18 <= fStack_fa0) &
                               (uint)((DAT_01f46a60._8_4_ - fStack_1110 * fVar109) * fVar109 +
                                     fVar109));
              fVar161 = (float)(-(uint)(1e-18 <= fStack_f9c) &
                               (uint)((DAT_01f46a60._12_4_ - fStack_110c * fVar161) * fVar161 +
                                     fVar161));
              auVar182._0_4_ = fVar178 * fVar144;
              auVar182._4_4_ = fVar186 * fVar155;
              auVar182._8_4_ = auVar179._8_4_ * fVar109;
              auVar182._12_4_ = auVar179._12_4_ * fVar161;
              auVar131 = minps(auVar182,_DAT_01f46a60);
              auVar135._0_4_ = auVar133._0_4_ * fVar144;
              auVar135._4_4_ = auVar133._4_4_ * fVar155;
              auVar135._8_4_ = auVar133._8_4_ * fVar109;
              auVar135._12_4_ = auVar133._12_4_ * fVar161;
              auVar96 = minps(auVar135,_DAT_01f46a60);
              auVar101._4_4_ = auVar94._4_4_;
              auVar118._0_8_ = auVar94._0_8_;
              auVar101._8_4_ = auVar94._8_4_;
              auVar118._8_4_ = auVar101._4_4_;
              uVar75 = auVar76._4_4_;
              auVar118._12_4_ = uVar75;
              uVar74 = auVar76._0_4_;
              auVar117._8_8_ = auVar118._8_8_;
              auVar117._0_4_ = auVar94._0_4_;
              auVar117._4_4_ = uVar74;
              auVar101._0_4_ = auVar101._4_4_;
              auVar101._12_4_ = auVar101._8_4_;
              auVar79._0_8_ = auVar76._0_8_;
              auVar79._8_4_ = uVar75;
              auVar79._12_4_ = auVar76._8_4_;
              auVar100 = ZEXT816(0);
              auVar43 = pblendw(auVar117,auVar100,0xaa);
              auVar180 = pblendw(auVar101,auVar100,0xaa);
              auVar100 = pblendw(auVar79,auVar100,0xaa);
              fVar93 = auVar131._0_4_;
              fVar92 = auVar131._4_4_;
              fVar187 = auVar131._8_4_;
              fVar42 = auVar131._12_4_;
              fVar190 = auVar96._0_4_;
              fVar191 = auVar96._4_4_;
              fVar167 = auVar96._8_4_;
              fVar137 = auVar96._12_4_;
              fVar144 = ((float)DAT_01f46a60 - fVar93) - fVar190;
              fVar155 = (DAT_01f46a60._4_4_ - fVar92) - fVar191;
              fVar109 = (DAT_01f46a60._8_4_ - fVar187) - fVar167;
              fVar161 = (DAT_01f46a60._12_4_ - fVar42) - fVar137;
              local_1178[0] =
                   (float)auVar43._0_4_ * 0.00012207031 * fVar144 +
                   (float)auVar100._0_4_ * 0.00012207031 * fVar190 +
                   (float)auVar180._0_4_ * 0.00012207031 * fVar93;
              local_1178[1] =
                   (float)auVar43._4_4_ * 0.00012207031 * fVar155 +
                   (float)auVar100._4_4_ * 0.00012207031 * fVar191 +
                   (float)auVar180._4_4_ * 0.00012207031 * fVar92;
              local_1178[2] =
                   (float)auVar43._8_4_ * 0.00012207031 * fVar109 +
                   (float)auVar100._8_4_ * 0.00012207031 * fVar167 +
                   (float)auVar180._8_4_ * 0.00012207031 * fVar187;
              local_1178[3] =
                   (float)auVar43._12_4_ * 0.00012207031 * fVar161 +
                   (float)auVar100._12_4_ * 0.00012207031 * fVar137 +
                   (float)auVar180._12_4_ * 0.00012207031 * fVar42;
              local_1168[0] =
                   fVar144 * (float)(auVar117._0_4_ >> 0x10) * 0.00012207031 +
                   (float)(uVar74 >> 0x10) * 0.00012207031 * fVar190 +
                   (float)(auVar101._4_4_ >> 0x10) * 0.00012207031 * fVar93;
              local_1168[1] =
                   fVar155 * (float)(uVar74 >> 0x10) * 0.00012207031 +
                   (float)(uVar75 >> 0x10) * 0.00012207031 * fVar191 +
                   (float)(auVar101._4_4_ >> 0x10) * 0.00012207031 * fVar92;
              local_1168[2] =
                   fVar109 * (float)(auVar101._4_4_ >> 0x10) * 0.00012207031 +
                   (float)(uVar75 >> 0x10) * 0.00012207031 * fVar167 +
                   (float)(auVar101._8_4_ >> 0x10) * 0.00012207031 * fVar187;
              local_1168[3] =
                   fVar161 * (float)(uVar75 >> 0x10) * 0.00012207031 +
                   (float)(auVar76._8_4_ >> 0x10) * 0.00012207031 * fVar137 +
                   (float)(auVar101._8_4_ >> 0x10) * 0.00012207031 * fVar42;
              auVar15._4_4_ = fVar73;
              auVar15._0_4_ = fVar148;
              auVar15._8_4_ = fVar105;
              auVar15._12_4_ = fVar154;
              auVar180 = blendvps(_DAT_01f45a30,auVar15,(undefined1  [16])valid.field_0);
              auVar119._4_4_ = auVar180._0_4_;
              auVar119._0_4_ = auVar180._4_4_;
              auVar119._8_4_ = auVar180._12_4_;
              auVar119._12_4_ = auVar180._8_4_;
              auVar100 = minps(auVar119,auVar180);
              auVar80._0_8_ = auVar100._8_8_;
              auVar80._8_4_ = auVar100._0_4_;
              auVar80._12_4_ = auVar100._4_4_;
              auVar100 = minps(auVar80,auVar100);
              uVar37 = -(uint)(auVar100._0_4_ == auVar180._0_4_);
              uVar38 = -(uint)(auVar100._4_4_ == auVar180._4_4_);
              uVar39 = -(uint)(auVar100._8_4_ == auVar180._8_4_);
              uVar40 = -(uint)(auVar100._12_4_ == auVar180._12_4_);
              auVar102._0_4_ = uVar37 & valid.field_0.i[0];
              auVar102._4_4_ = uVar38 & valid.field_0.i[1];
              auVar102._8_4_ = uVar39 & valid.field_0.i[2];
              auVar102._12_4_ = uVar40 & valid.field_0.i[3];
              iVar25 = movmskps((int)local_1250,auVar102);
              uVar74 = 0xffffffff;
              uVar75 = 0xffffffff;
              uVar90 = 0xffffffff;
              uVar111 = 0xffffffff;
              if (iVar25 != 0) {
                uVar74 = uVar37;
                uVar75 = uVar38;
                uVar90 = uVar39;
                uVar111 = uVar40;
              }
              auVar58._0_4_ = valid.field_0.i[0] & uVar74;
              auVar58._4_4_ = valid.field_0.i[1] & uVar75;
              auVar58._8_4_ = valid.field_0.i[2] & uVar90;
              auVar58._12_4_ = valid.field_0.i[3] & uVar111;
              uVar31 = movmskps(iVar25,auVar58);
              uVar23 = CONCAT44((int)((ulong)local_1250 >> 0x20),uVar31);
              lVar29 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar144 = local_1178[lVar29];
                fVar72 = local_1168[lVar29];
                uVar31 = *(undefined4 *)(local_1148 + lVar29 * 4);
                uVar5 = *(undefined4 *)(local_1138 + lVar29 * 4);
                uVar6 = *(undefined4 *)(local_1128 + lVar29 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + lVar29 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar31;
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar5;
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar6;
                *(float *)(ray + k * 4 + 0xf0) = fVar144;
                *(float *)(ray + k * 4 + 0x100) = fVar72;
                *(undefined4 *)(ray + k * 4 + 0x110) = uVar7;
                *(uint *)(ray + k * 4 + 0x120) = (uint)uStack_12b0;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_12b8 = CONCAT44((uint)uStack_12b0,(uint)uStack_12b0);
                uStack_12b0._4_4_ = (uint)uStack_12b0;
                local_1298 = CONCAT44(uVar7,uVar7);
                auVar94 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar21);
                uStack_11dc = (undefined4)
                              ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar21 + 8) >> 0x20);
                local_1248 = uVar27;
                local_1240 = (ulong)uVar20;
                local_1238 = fVar148;
                fStack_1234 = fVar73;
                fStack_1230 = fVar105;
                fStack_122c = fVar154;
                local_1228 = uVar27;
                while( true ) {
                  local_1088 = local_1178[lVar29];
                  fVar144 = local_1168[lVar29];
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + lVar29 * 4);
                  args.context = context->user;
                  local_1078._4_4_ = fVar144;
                  local_1078._0_4_ = fVar144;
                  local_1078._8_4_ = fVar144;
                  local_1078._12_4_ = fVar144;
                  local_10b8 = *(undefined4 *)(local_1148 + lVar29 * 4);
                  uVar31 = *(undefined4 *)(local_1138 + lVar29 * 4);
                  uVar5 = *(undefined4 *)(local_1128 + lVar29 * 4);
                  local_10a8._4_4_ = uVar31;
                  local_10a8._0_4_ = uVar31;
                  local_10a8._8_4_ = uVar31;
                  local_10a8._12_4_ = uVar31;
                  local_1098._4_4_ = uVar5;
                  local_1098._0_4_ = uVar5;
                  local_1098._8_4_ = uVar5;
                  local_1098._12_4_ = uVar5;
                  uStack_10b4 = local_10b8;
                  uStack_10b0 = local_10b8;
                  uStack_10ac = local_10b8;
                  fStack_1084 = local_1088;
                  fStack_1080 = local_1088;
                  fStack_107c = local_1088;
                  local_1068 = local_1298;
                  uStack_1060 = CONCAT44(uVar7,uVar7);
                  local_1058 = local_12b8;
                  uStack_1050 = uStack_12b0;
                  local_1048 = (args.context)->instID[0];
                  uStack_1044 = local_1048;
                  uStack_1040 = local_1048;
                  uStack_103c = local_1048;
                  local_1038 = (args.context)->instPrimID[0];
                  uStack_1034 = local_1038;
                  uStack_1030 = local_1038;
                  uStack_102c = local_1038;
                  local_1268._12_4_ = uStack_11dc;
                  local_1268._0_12_ = auVar94;
                  args.valid = (int *)local_1268;
                  args.geometryUserPtr = pGVar10->userPtr;
                  args.hit = (RTCHitN *)&local_10b8;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar10->intersectionFilterN)(&args);
                    uVar27 = local_1228;
                    fVar148 = local_1238;
                    fVar73 = fStack_1234;
                    fVar105 = fStack_1230;
                    fVar154 = fStack_122c;
                  }
                  if (local_1268 == (undefined1  [16])0x0) {
                    auVar84._8_4_ = 0xffffffff;
                    auVar84._0_8_ = 0xffffffffffffffff;
                    auVar84._12_4_ = 0xffffffff;
                    auVar84 = auVar84 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&args);
                      uVar27 = local_1228;
                      fVar148 = local_1238;
                      fVar73 = fStack_1234;
                      fVar105 = fStack_1230;
                      fVar154 = fStack_122c;
                    }
                    auVar67._0_4_ = -(uint)(local_1268._0_4_ == 0);
                    auVar67._4_4_ = -(uint)(local_1268._4_4_ == 0);
                    auVar67._8_4_ = -(uint)(local_1268._8_4_ == 0);
                    auVar67._12_4_ = -(uint)(local_1268._12_4_ == 0);
                    auVar84 = auVar67 ^ _DAT_01f46b70;
                    if (local_1268 != (undefined1  [16])0x0) {
                      auVar100 = blendvps(*(undefined1 (*) [16])args.hit,
                                          *(undefined1 (*) [16])(args.ray + 0xc0),auVar67);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar100;
                      auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                          *(undefined1 (*) [16])(args.ray + 0xd0),auVar67);
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar100;
                      auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                          *(undefined1 (*) [16])(args.ray + 0xe0),auVar67);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar100;
                      auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                          *(undefined1 (*) [16])(args.ray + 0xf0),auVar67);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar100;
                      auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                          *(undefined1 (*) [16])(args.ray + 0x100),auVar67);
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar100;
                      auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                          *(undefined1 (*) [16])(args.ray + 0x110),auVar67);
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar100;
                      auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                          *(undefined1 (*) [16])(args.ray + 0x120),auVar67);
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar100;
                      auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                          *(undefined1 (*) [16])(args.ray + 0x130),auVar67);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar100;
                      auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                          *(undefined1 (*) [16])(args.ray + 0x140),auVar67);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar100;
                    }
                  }
                  if ((_DAT_01f46b40 & auVar84) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar72;
                  }
                  else {
                    fVar72 = *(float *)(ray + k * 4 + 0x80);
                  }
                  *(undefined4 *)(local_1268 + lVar29 * 4 + -0x10) = 0;
                  valid.field_0.i[0] = -(uint)(fVar148 <= fVar72) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar73 <= fVar72) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar105 <= fVar72) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar154 <= fVar72) & valid.field_0.i[3];
                  iVar25 = movmskps((int)lVar29,(undefined1  [16])valid.field_0);
                  if (iVar25 == 0) break;
                  auVar16._4_4_ = fVar73;
                  auVar16._0_4_ = fVar148;
                  auVar16._8_4_ = fVar105;
                  auVar16._12_4_ = fVar154;
                  auVar180 = blendvps(_DAT_01f45a30,auVar16,(undefined1  [16])valid.field_0);
                  auVar125._4_4_ = auVar180._0_4_;
                  auVar125._0_4_ = auVar180._4_4_;
                  auVar125._8_4_ = auVar180._12_4_;
                  auVar125._12_4_ = auVar180._8_4_;
                  auVar100 = minps(auVar125,auVar180);
                  auVar85._0_8_ = auVar100._8_8_;
                  auVar85._8_4_ = auVar100._0_4_;
                  auVar85._12_4_ = auVar100._4_4_;
                  auVar100 = minps(auVar85,auVar100);
                  auVar86._0_8_ =
                       CONCAT44(-(uint)(auVar100._4_4_ == auVar180._4_4_) & valid.field_0.i[1],
                                -(uint)(auVar100._0_4_ == auVar180._0_4_) & valid.field_0.i[0]);
                  auVar86._8_4_ = -(uint)(auVar100._8_4_ == auVar180._8_4_) & valid.field_0.i[2];
                  auVar86._12_4_ = -(uint)(auVar100._12_4_ == auVar180._12_4_) & valid.field_0.i[3];
                  iVar25 = movmskps(iVar25,auVar86);
                  aVar68 = valid.field_0;
                  if (iVar25 != 0) {
                    aVar68.i[2] = auVar86._8_4_;
                    aVar68._0_8_ = auVar86._0_8_;
                    aVar68.i[3] = auVar86._12_4_;
                  }
                  uVar31 = movmskps(iVar25,(undefined1  [16])aVar68);
                  uVar23 = CONCAT44((int)((ulong)lVar29 >> 0x20),uVar31);
                  lVar29 = 0;
                  if (uVar23 != 0) {
                    for (; (uVar23 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (2 < uVar20) {
        lVar34 = uVar27 * 4 + lVar34;
        pGVar28 = pGVar9 + lVar34 + 0x2c;
        fVar144 = *(float *)(pGVar9 + lVar34 + 0x30);
        pGVar30 = pGVar28 + uVar27 * 4;
        fVar72 = *(float *)(pGVar30 + 4);
        fVar148 = *(float *)(pGVar9 + lVar34 + 0x34);
        fVar73 = *(float *)(pGVar30 + 8);
        if (uVar27 == 2) {
          fVar148 = fVar144;
          fVar73 = fVar72;
        }
        pGVar11 = (local_1258->super_Precalculations).grid;
        uVar23 = (ulong)*(uint *)(pGVar11 + 0x14);
        pGVar9 = pGVar28 + uVar23 * 4;
        fVar105 = *(float *)(pGVar9 + 4);
        pGVar1 = pGVar9 + uVar27 * 4;
        fVar154 = *(float *)(pGVar1 + 4);
        fVar155 = *(float *)(pGVar9 + 8);
        fVar109 = *(float *)(pGVar1 + 8);
        if (uVar27 == 2) {
          fVar155 = fVar105;
          fVar109 = fVar154;
        }
        pGVar2 = pGVar28 + uVar23 * 8;
        fVar161 = *(float *)(pGVar2 + 4);
        pGVar3 = pGVar2 + uVar27 * 4;
        fVar190 = *(float *)(pGVar3 + 4);
        fVar191 = *(float *)(pGVar3 + 8);
        fVar167 = *(float *)(pGVar2 + 8);
        if (uVar27 == 2) {
          fVar191 = fVar190;
          fVar167 = fVar161;
        }
        local_1250 = pGVar28 + uVar23 * 0xc;
        fVar137 = *(float *)(ray + k * 4);
        fVar93 = *(float *)(ray + k * 4 + 0x10);
        fVar92 = *(float *)(ray + k * 4 + 0x20);
        fVar187 = *(float *)(ray + k * 4 + 0x40);
        fVar91 = *(float *)pGVar28 - fVar137;
        fVar106 = *(float *)pGVar30 - fVar137;
        fVar107 = fVar144 - fVar137;
        fVar108 = fVar72 - fVar137;
        local_1238 = *(float *)pGVar9 - fVar93;
        fStack_1234 = *(float *)pGVar1 - fVar93;
        fStack_1230 = fVar105 - fVar93;
        fStack_122c = fVar154 - fVar93;
        fVar198 = *(float *)pGVar2 - fVar92;
        fVar199 = *(float *)pGVar3 - fVar92;
        fVar200 = fVar161 - fVar92;
        fVar201 = fVar190 - fVar92;
        fVar110 = fVar144 - fVar137;
        fVar144 = fVar144 - fVar137;
        fVar138 = fVar148 - fVar137;
        fVar148 = fVar148 - fVar137;
        fVar166 = fVar105 - fVar93;
        fVar105 = fVar105 - fVar93;
        fVar170 = fVar155 - fVar93;
        fVar155 = fVar155 - fVar93;
        fVar146 = fVar161 - fVar92;
        fVar161 = fVar161 - fVar92;
        fVar147 = fVar167 - fVar92;
        fVar167 = fVar167 - fVar92;
        fVar42 = *(float *)pGVar30 - fVar137;
        fVar71 = fVar72 - fVar137;
        fVar72 = fVar72 - fVar137;
        fVar73 = fVar73 - fVar137;
        fVar164 = *(float *)pGVar1 - fVar93;
        fVar165 = fVar154 - fVar93;
        fVar154 = fVar154 - fVar93;
        fVar109 = fVar109 - fVar93;
        fVar202 = *(float *)pGVar3 - fVar92;
        fVar204 = fVar190 - fVar92;
        fVar190 = fVar190 - fVar92;
        fVar191 = fVar191 - fVar92;
        fVar168 = fVar42 - fVar91;
        fVar169 = fVar71 - fVar106;
        fVar171 = fVar72 - fVar107;
        fVar174 = fVar73 - fVar108;
        fVar93 = fVar164 - local_1238;
        fVar92 = fVar165 - fStack_1234;
        fVar139 = fVar154 - fStack_1230;
        fVar145 = fVar109 - fStack_122c;
        fVar186 = fVar202 - fVar198;
        fVar189 = fVar204 - fVar199;
        fVar194 = fVar190 - fVar200;
        fVar196 = fVar191 - fVar201;
        fVar137 = *(float *)(ray + k * 4 + 0x50);
        fStack_1220 = *(float *)(ray + k * 4 + 0x60);
        fVar175 = fVar91 - fVar110;
        fVar176 = fVar106 - fVar144;
        fVar177 = fVar107 - fVar138;
        fVar178 = fVar108 - fVar148;
        fVar206 = (fVar93 * (fVar202 + fVar198) - (fVar164 + local_1238) * fVar186) * fVar187 +
                  ((fVar42 + fVar91) * fVar186 - (fVar202 + fVar198) * fVar168) * fVar137 +
                  (fVar168 * (fVar164 + local_1238) - (fVar42 + fVar91) * fVar93) * fStack_1220;
        fVar203 = (fVar92 * (fVar204 + fVar199) - (fVar165 + fStack_1234) * fVar189) * fVar187 +
                  ((fVar71 + fVar106) * fVar189 - (fVar204 + fVar199) * fVar169) * fVar137 +
                  (fVar169 * (fVar165 + fStack_1234) - (fVar71 + fVar106) * fVar92) * fStack_1220;
        fVar205 = (fVar139 * (fVar190 + fVar200) - (fVar154 + fStack_1230) * fVar194) * fVar187 +
                  ((fVar72 + fVar107) * fVar194 - (fVar190 + fVar200) * fVar171) * fVar137 +
                  (fVar171 * (fVar154 + fStack_1230) - (fVar72 + fVar107) * fVar139) * fStack_1220;
        fVar207 = (fVar145 * (fVar191 + fVar201) - (fVar109 + fStack_122c) * fVar196) * fVar187 +
                  ((fVar73 + fVar108) * fVar196 - (fVar191 + fVar201) * fVar174) * fVar137 +
                  (fVar174 * (fVar109 + fStack_122c) - (fVar73 + fVar108) * fVar145) * fStack_1220;
        fVar188 = local_1238 - fVar166;
        fVar193 = fStack_1234 - fVar105;
        fVar195 = fStack_1230 - fVar170;
        fVar197 = fStack_122c - fVar155;
        local_10e8 = fVar198 - fVar146;
        fStack_10e4 = fVar199 - fVar161;
        fStack_10e0 = fVar200 - fVar147;
        fStack_10dc = fVar201 - fVar167;
        auVar183._0_4_ =
             (fVar188 * (fVar198 + fVar146) - (local_1238 + fVar166) * local_10e8) * fVar187 +
             ((fVar91 + fVar110) * local_10e8 - (fVar198 + fVar146) * fVar175) * fVar137 +
             (fVar175 * (local_1238 + fVar166) - (fVar91 + fVar110) * fVar188) * fStack_1220;
        auVar183._4_4_ =
             (fVar193 * (fVar199 + fVar161) - (fStack_1234 + fVar105) * fStack_10e4) * fVar187 +
             ((fVar106 + fVar144) * fStack_10e4 - (fVar199 + fVar161) * fVar176) * fVar137 +
             (fVar176 * (fStack_1234 + fVar105) - (fVar106 + fVar144) * fVar193) * fStack_1220;
        auVar183._8_4_ =
             (fVar195 * (fVar200 + fVar147) - (fStack_1230 + fVar170) * fStack_10e0) * fVar187 +
             ((fVar107 + fVar138) * fStack_10e0 - (fVar200 + fVar147) * fVar177) * fVar137 +
             (fVar177 * (fStack_1230 + fVar170) - (fVar107 + fVar138) * fVar195) * fStack_1220;
        auVar183._12_4_ =
             (fVar197 * (fVar201 + fVar167) - (fStack_122c + fVar155) * fStack_10dc) * fVar187 +
             ((fVar108 + fVar148) * fStack_10dc - (fVar201 + fVar167) * fVar178) * fVar137 +
             (fVar178 * (fStack_122c + fVar155) - (fVar108 + fVar148) * fVar197) * fStack_1220;
        fVar157 = fVar110 - fVar42;
        fVar158 = fVar144 - fVar71;
        fVar162 = fVar138 - fVar72;
        fVar163 = fVar148 - fVar73;
        local_1108 = fVar166 - fVar164;
        fStack_1104 = fVar105 - fVar165;
        fStack_1100 = fVar170 - fVar154;
        fStack_10fc = fVar155 - fVar109;
        fVar149 = fVar146 - fVar202;
        fVar152 = fVar161 - fVar204;
        fVar153 = fVar147 - fVar190;
        fVar156 = fVar167 - fVar191;
        local_1228 = CONCAT44(fStack_1220,fStack_1220);
        auVar81._0_4_ =
             (local_1108 * (fVar202 + fVar146) - (fVar164 + fVar166) * fVar149) * fVar187 +
             ((fVar42 + fVar110) * fVar149 - (fVar202 + fVar146) * fVar157) * fVar137 +
             (fVar157 * (fVar164 + fVar166) - (fVar42 + fVar110) * local_1108) * fStack_1220;
        auVar81._4_4_ =
             (fStack_1104 * (fVar204 + fVar161) - (fVar165 + fVar105) * fVar152) * fVar187 +
             ((fVar71 + fVar144) * fVar152 - (fVar204 + fVar161) * fVar158) * fVar137 +
             (fVar158 * (fVar165 + fVar105) - (fVar71 + fVar144) * fStack_1104) * fStack_1220;
        auVar81._8_4_ =
             (fStack_1100 * (fVar190 + fVar147) - (fVar154 + fVar170) * fVar153) * fVar187 +
             ((fVar72 + fVar138) * fVar153 - (fVar190 + fVar147) * fVar162) * fVar137 +
             (fVar162 * (fVar154 + fVar170) - (fVar72 + fVar138) * fStack_1100) * fStack_1220;
        auVar81._12_4_ =
             (fStack_10fc * (fVar191 + fVar167) - (fVar109 + fVar155) * fVar156) * fVar187 +
             ((fVar73 + fVar148) * fVar156 - (fVar191 + fVar167) * fVar163) * fVar137 +
             (fVar163 * (fVar109 + fVar155) - (fVar73 + fVar148) * fStack_10fc) * fStack_1220;
        local_10f8._0_4_ = fVar206 + auVar183._0_4_ + auVar81._0_4_;
        local_10f8._4_4_ = fVar203 + auVar183._4_4_ + auVar81._4_4_;
        fStack_10f0 = fVar205 + auVar183._8_4_ + auVar81._8_4_;
        fStack_10ec = fVar207 + auVar183._12_4_ + auVar81._12_4_;
        auVar59._4_4_ = fVar203;
        auVar59._0_4_ = fVar206;
        auVar59._8_4_ = fVar205;
        auVar59._12_4_ = fVar207;
        auVar100 = minps(auVar59,auVar183);
        auVar180 = minps(auVar100,auVar81);
        local_12f8 = CONCAT44(fVar203,fVar206);
        uStack_12f0._0_4_ = fVar205;
        uStack_12f0._4_4_ = fVar207;
        auVar120._4_4_ = fVar203;
        auVar120._0_4_ = fVar206;
        auVar120._8_4_ = fVar205;
        auVar120._12_4_ = fVar207;
        auVar100 = maxps(auVar120,auVar183);
        auVar43 = maxps(auVar100,auVar81);
        fStack_1110 = ABS(fStack_10f0);
        fStack_110c = ABS(fStack_10ec);
        uVar23 = CONCAT44(local_10f8._4_4_,local_10f8._0_4_);
        local_1118 = (undefined1  [8])(uVar23 & 0x7fffffff7fffffff);
        auVar100 = _local_1118;
        auVar121._4_4_ = -(uint)(auVar43._4_4_ <= ABS((float)local_10f8._4_4_) * 1.1920929e-07);
        auVar121._0_4_ = -(uint)(auVar43._0_4_ <= ABS((float)local_10f8._0_4_) * 1.1920929e-07);
        auVar121._8_4_ = -(uint)(auVar43._8_4_ <= fStack_1110 * 1.1920929e-07);
        auVar121._12_4_ = -(uint)(auVar43._12_4_ <= fStack_110c * 1.1920929e-07);
        auVar60._4_4_ = -(uint)(-(ABS((float)local_10f8._4_4_) * 1.1920929e-07) <= auVar180._4_4_);
        auVar60._0_4_ = -(uint)(-(ABS((float)local_10f8._0_4_) * 1.1920929e-07) <= auVar180._0_4_);
        auVar60._8_4_ = -(uint)(-(fStack_1110 * 1.1920929e-07) <= auVar180._8_4_);
        auVar60._12_4_ = -(uint)(-(fStack_110c * 1.1920929e-07) <= auVar180._12_4_);
        auVar121 = auVar121 | auVar60;
        iVar25 = movmskps(uVar20,auVar121);
        if (iVar25 != 0) {
          auVar151._0_4_ = fVar93 * local_10e8 - fVar188 * fVar186;
          auVar151._4_4_ = fVar92 * fStack_10e4 - fVar193 * fVar189;
          auVar151._8_4_ = fVar139 * fStack_10e0 - fVar195 * fVar194;
          auVar151._12_4_ = fVar145 * fStack_10dc - fVar197 * fVar196;
          auVar173._0_4_ = fVar188 * fVar149 - local_1108 * local_10e8;
          auVar173._4_4_ = fVar193 * fVar152 - fStack_1104 * fStack_10e4;
          auVar173._8_4_ = fVar195 * fVar153 - fStack_1100 * fStack_10e0;
          auVar173._12_4_ = fVar197 * fVar156 - fStack_10fc * fStack_10dc;
          auVar61._4_4_ = -(uint)(ABS(fVar193 * fVar189) < ABS(fStack_1104 * fStack_10e4));
          auVar61._0_4_ = -(uint)(ABS(fVar188 * fVar186) < ABS(local_1108 * local_10e8));
          auVar61._8_4_ = -(uint)(ABS(fVar195 * fVar194) < ABS(fStack_1100 * fStack_10e0));
          auVar61._12_4_ = -(uint)(ABS(fVar197 * fVar196) < ABS(fStack_10fc * fStack_10dc));
          local_1148 = blendvps(auVar173,auVar151,auVar61);
          auVar143._0_4_ = fVar157 * local_10e8 - fVar175 * fVar149;
          auVar143._4_4_ = fVar158 * fStack_10e4 - fVar176 * fVar152;
          auVar143._8_4_ = fVar162 * fStack_10e0 - fVar177 * fVar153;
          auVar143._12_4_ = fVar163 * fStack_10dc - fVar178 * fVar156;
          auVar62._4_4_ = -(uint)(ABS(fVar169 * fStack_10e4) < ABS(fVar176 * fVar152));
          auVar62._0_4_ = -(uint)(ABS(fVar168 * local_10e8) < ABS(fVar175 * fVar149));
          auVar62._8_4_ = -(uint)(ABS(fVar171 * fStack_10e0) < ABS(fVar177 * fVar153));
          auVar62._12_4_ = -(uint)(ABS(fVar174 * fStack_10dc) < ABS(fVar178 * fVar156));
          auVar18._4_4_ = fVar189 * fVar176 - fVar169 * fStack_10e4;
          auVar18._0_4_ = fVar186 * fVar175 - fVar168 * local_10e8;
          auVar18._8_4_ = fVar194 * fVar177 - fVar171 * fStack_10e0;
          auVar18._12_4_ = fVar196 * fVar178 - fVar174 * fStack_10dc;
          local_1138 = blendvps(auVar143,auVar18,auVar62);
          auVar184._0_4_ = fVar168 * fVar188 - fVar175 * fVar93;
          auVar184._4_4_ = fVar169 * fVar193 - fVar176 * fVar92;
          auVar184._8_4_ = fVar171 * fVar195 - fVar177 * fVar139;
          auVar184._12_4_ = fVar174 * fVar197 - fVar178 * fVar145;
          auVar160._0_4_ = fVar175 * local_1108 - fVar157 * fVar188;
          auVar160._4_4_ = fVar176 * fStack_1104 - fVar158 * fVar193;
          auVar160._8_4_ = fVar177 * fStack_1100 - fVar162 * fVar195;
          auVar160._12_4_ = fVar178 * fStack_10fc - fVar163 * fVar197;
          auVar63._4_4_ = -(uint)(ABS(fVar176 * fVar92) < ABS(fVar158 * fVar193));
          auVar63._0_4_ = -(uint)(ABS(fVar175 * fVar93) < ABS(fVar157 * fVar188));
          auVar63._8_4_ = -(uint)(ABS(fVar177 * fVar139) < ABS(fVar162 * fVar195));
          auVar63._12_4_ = -(uint)(ABS(fVar178 * fVar145) < ABS(fVar163 * fVar197));
          local_1128 = blendvps(auVar160,auVar184,auVar63);
          fVar144 = fVar187 * local_1148._0_4_ +
                    fVar137 * local_1138._0_4_ + fStack_1220 * local_1128._0_4_;
          fVar72 = fVar187 * local_1148._4_4_ +
                   fVar137 * local_1138._4_4_ + fStack_1220 * local_1128._4_4_;
          fVar148 = fVar187 * local_1148._8_4_ +
                    fVar137 * local_1138._8_4_ + fStack_1220 * local_1128._8_4_;
          fVar73 = fVar187 * local_1148._12_4_ +
                   fVar137 * local_1138._12_4_ + fStack_1220 * local_1128._12_4_;
          auVar129._0_4_ = fVar144 + fVar144;
          auVar129._4_4_ = fVar72 + fVar72;
          auVar129._8_4_ = fVar148 + fVar148;
          auVar129._12_4_ = fVar73 + fVar73;
          auVar64._0_4_ = fVar198 * local_1128._0_4_;
          auVar64._4_4_ = fVar199 * local_1128._4_4_;
          auVar64._8_4_ = fVar200 * local_1128._8_4_;
          auVar64._12_4_ = fVar201 * local_1128._12_4_;
          fVar105 = fVar91 * local_1148._0_4_ + local_1238 * local_1138._0_4_ + auVar64._0_4_;
          fVar154 = fVar106 * local_1148._4_4_ + fStack_1234 * local_1138._4_4_ + auVar64._4_4_;
          fVar155 = fVar107 * local_1148._8_4_ + fStack_1230 * local_1138._8_4_ + auVar64._8_4_;
          fVar109 = fVar108 * local_1148._12_4_ + fStack_122c * local_1138._12_4_ + auVar64._12_4_;
          auVar180 = rcpps(auVar64,auVar129);
          fVar144 = auVar180._0_4_;
          fVar72 = auVar180._4_4_;
          fVar148 = auVar180._8_4_;
          fVar73 = auVar180._12_4_;
          auVar185._0_4_ =
               ((1.0 - auVar129._0_4_ * fVar144) * fVar144 + fVar144) * (fVar105 + fVar105);
          auVar185._4_4_ = ((1.0 - auVar129._4_4_ * fVar72) * fVar72 + fVar72) * (fVar154 + fVar154)
          ;
          auVar185._8_4_ =
               ((1.0 - auVar129._8_4_ * fVar148) * fVar148 + fVar148) * (fVar155 + fVar155);
          auVar185._12_4_ =
               ((1.0 - auVar129._12_4_ * fVar73) * fVar73 + fVar73) * (fVar109 + fVar109);
          fVar72 = *(float *)(ray + k * 4 + 0x80);
          fVar144 = *(float *)(ray + k * 4 + 0x30);
          auVar65._0_4_ =
               -(uint)(auVar185._0_4_ <= fVar72 && fVar144 <= auVar185._0_4_) & auVar121._0_4_;
          auVar65._4_4_ =
               -(uint)(auVar185._4_4_ <= fVar72 && fVar144 <= auVar185._4_4_) & auVar121._4_4_;
          auVar65._8_4_ =
               -(uint)(auVar185._8_4_ <= fVar72 && fVar144 <= auVar185._8_4_) & auVar121._8_4_;
          auVar65._12_4_ =
               -(uint)(auVar185._12_4_ <= fVar72 && fVar144 <= auVar185._12_4_) & auVar121._12_4_;
          iVar25 = movmskps(iVar25,auVar65);
          if (iVar25 != 0) {
            valid.field_0.i[0] = auVar65._0_4_ & -(uint)(auVar129._0_4_ != 0.0);
            valid.field_0.i[1] = auVar65._4_4_ & -(uint)(auVar129._4_4_ != 0.0);
            valid.field_0.i[2] = auVar65._8_4_ & -(uint)(auVar129._8_4_ != 0.0);
            valid.field_0.i[3] = auVar65._12_4_ & -(uint)(auVar129._12_4_ != 0.0);
            iVar25 = movmskps(iVar25,(undefined1  [16])valid.field_0);
            if (iVar25 != 0) {
              uVar74 = *(uint *)(pGVar11 + 0x18);
              uVar7 = *(undefined4 *)(pGVar11 + 0x1c);
              tNear.field_0._8_8_ = uStack_12f0;
              tNear.field_0._0_8_ = local_12f8;
              _local_1158 = auVar185;
              pGVar10 = (context->scene->geometries).items[uVar74].ptr;
              if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar180 = *(undefined1 (*) [16])local_1250;
                auVar95 = auVar180._0_12_;
                auVar43 = *(undefined1 (*) [16])(local_1250 + uVar27 * 4);
                auVar77 = auVar43._0_12_;
                if (uVar27 == 2) {
                  auVar95._0_8_ = auVar180._0_8_;
                  auVar95._8_4_ = auVar180._4_4_;
                  auVar77._0_8_ = auVar43._0_8_;
                  auVar77._8_4_ = auVar43._4_4_;
                }
                auVar180 = rcpps(auVar121,_local_10f8);
                fVar144 = auVar180._0_4_;
                fVar148 = auVar180._4_4_;
                fVar73 = auVar180._8_4_;
                fVar105 = auVar180._12_4_;
                fVar144 = (float)(-(uint)(1e-18 <= (float)local_1118._0_4_) &
                                 (uint)(((float)DAT_01f46a60 - (float)local_10f8._0_4_ * fVar144) *
                                        fVar144 + fVar144));
                fVar148 = (float)(-(uint)(1e-18 <= (float)local_1118._4_4_) &
                                 (uint)((DAT_01f46a60._4_4_ - (float)local_10f8._4_4_ * fVar148) *
                                        fVar148 + fVar148));
                fVar73 = (float)(-(uint)(1e-18 <= fStack_1110) &
                                (uint)((DAT_01f46a60._8_4_ - fStack_10f0 * fVar73) * fVar73 + fVar73
                                      ));
                fVar105 = (float)(-(uint)(1e-18 <= fStack_110c) &
                                 (uint)((DAT_01f46a60._12_4_ - fStack_10ec * fVar105) * fVar105 +
                                       fVar105));
                auVar192._0_4_ = fVar206 * fVar144;
                auVar192._4_4_ = fVar203 * fVar148;
                auVar192._8_4_ = fVar205 * fVar73;
                auVar192._12_4_ = fVar207 * fVar105;
                auVar141 = minps(auVar192,_DAT_01f46a60);
                auVar136._0_4_ = auVar183._0_4_ * fVar144;
                auVar136._4_4_ = auVar183._4_4_ * fVar148;
                auVar136._8_4_ = auVar183._8_4_ * fVar73;
                auVar136._12_4_ = auVar183._12_4_ * fVar105;
                auVar131 = minps(auVar136,_DAT_01f46a60);
                auVar103._4_4_ = auVar95._4_4_;
                auVar123._0_8_ = auVar95._0_8_;
                auVar103._8_4_ = auVar95._8_4_;
                auVar123._8_4_ = auVar103._4_4_;
                uVar90 = auVar77._4_4_;
                auVar123._12_4_ = uVar90;
                uVar75 = auVar77._0_4_;
                auVar122._8_8_ = auVar123._8_8_;
                auVar122._0_4_ = auVar95._0_4_;
                auVar122._4_4_ = uVar75;
                auVar103._0_4_ = auVar103._4_4_;
                auVar103._12_4_ = auVar103._8_4_;
                auVar82._0_8_ = auVar77._0_8_;
                auVar82._8_4_ = uVar90;
                auVar82._12_4_ = auVar77._8_4_;
                auVar180 = ZEXT816(0);
                auVar96 = pblendw(auVar122,auVar180,0xaa);
                auVar43 = pblendw(auVar103,auVar180,0xaa);
                auVar180 = pblendw(auVar82,auVar180,0xaa);
                fVar190 = auVar141._0_4_;
                fVar191 = auVar141._4_4_;
                fVar167 = auVar141._8_4_;
                fVar137 = auVar141._12_4_;
                fVar154 = auVar131._0_4_;
                fVar155 = auVar131._4_4_;
                fVar109 = auVar131._8_4_;
                fVar161 = auVar131._12_4_;
                fVar144 = ((float)DAT_01f46a60 - fVar190) - fVar154;
                fVar148 = (DAT_01f46a60._4_4_ - fVar191) - fVar155;
                fVar73 = (DAT_01f46a60._8_4_ - fVar167) - fVar109;
                fVar105 = (DAT_01f46a60._12_4_ - fVar137) - fVar161;
                local_1178[0] =
                     (float)auVar96._0_4_ * 0.00012207031 * fVar144 +
                     (float)auVar180._0_4_ * 0.00012207031 * fVar154 +
                     (float)auVar43._0_4_ * 0.00012207031 * fVar190;
                local_1178[1] =
                     (float)auVar96._4_4_ * 0.00012207031 * fVar148 +
                     (float)auVar180._4_4_ * 0.00012207031 * fVar155 +
                     (float)auVar43._4_4_ * 0.00012207031 * fVar191;
                local_1178[2] =
                     (float)auVar96._8_4_ * 0.00012207031 * fVar73 +
                     (float)auVar180._8_4_ * 0.00012207031 * fVar109 +
                     (float)auVar43._8_4_ * 0.00012207031 * fVar167;
                local_1178[3] =
                     (float)auVar96._12_4_ * 0.00012207031 * fVar105 +
                     (float)auVar180._12_4_ * 0.00012207031 * fVar161 +
                     (float)auVar43._12_4_ * 0.00012207031 * fVar137;
                local_1168[0] =
                     fVar144 * (float)(auVar122._0_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar75 >> 0x10) * 0.00012207031 * fVar154 +
                     (float)(auVar103._4_4_ >> 0x10) * 0.00012207031 * fVar190;
                local_1168[1] =
                     fVar148 * (float)(uVar75 >> 0x10) * 0.00012207031 +
                     (float)(uVar90 >> 0x10) * 0.00012207031 * fVar155 +
                     (float)(auVar103._4_4_ >> 0x10) * 0.00012207031 * fVar191;
                local_1168[2] =
                     fVar73 * (float)(auVar103._4_4_ >> 0x10) * 0.00012207031 +
                     (float)(uVar90 >> 0x10) * 0.00012207031 * fVar109 +
                     (float)(auVar103._8_4_ >> 0x10) * 0.00012207031 * fVar167;
                local_1168[3] =
                     fVar105 * (float)(uVar90 >> 0x10) * 0.00012207031 +
                     (float)(auVar77._8_4_ >> 0x10) * 0.00012207031 * fVar161 +
                     (float)(auVar103._8_4_ >> 0x10) * 0.00012207031 * fVar137;
                auVar43 = blendvps(_DAT_01f45a30,auVar185,(undefined1  [16])valid.field_0);
                auVar124._4_4_ = auVar43._0_4_;
                auVar124._0_4_ = auVar43._4_4_;
                auVar124._8_4_ = auVar43._12_4_;
                auVar124._12_4_ = auVar43._8_4_;
                auVar180 = minps(auVar124,auVar43);
                auVar83._0_8_ = auVar180._8_8_;
                auVar83._8_4_ = auVar180._0_4_;
                auVar83._12_4_ = auVar180._4_4_;
                auVar180 = minps(auVar83,auVar180);
                uVar38 = -(uint)(auVar180._0_4_ == auVar43._0_4_);
                uVar39 = -(uint)(auVar180._4_4_ == auVar43._4_4_);
                uVar40 = -(uint)(auVar180._8_4_ == auVar43._8_4_);
                uVar41 = -(uint)(auVar180._12_4_ == auVar43._12_4_);
                auVar104._0_4_ = uVar38 & valid.field_0.i[0];
                auVar104._4_4_ = uVar39 & valid.field_0.i[1];
                auVar104._8_4_ = uVar40 & valid.field_0.i[2];
                auVar104._12_4_ = uVar41 & valid.field_0.i[3];
                iVar25 = movmskps((int)local_1250,auVar104);
                uVar75 = 0xffffffff;
                uVar90 = 0xffffffff;
                uVar111 = 0xffffffff;
                uVar37 = 0xffffffff;
                if (iVar25 != 0) {
                  uVar75 = uVar38;
                  uVar90 = uVar39;
                  uVar111 = uVar40;
                  uVar37 = uVar41;
                }
                auVar66._0_4_ = valid.field_0.i[0] & uVar75;
                auVar66._4_4_ = valid.field_0.i[1] & uVar90;
                auVar66._8_4_ = valid.field_0.i[2] & uVar111;
                auVar66._12_4_ = valid.field_0.i[3] & uVar37;
                uVar31 = movmskps(iVar25,auVar66);
                uVar23 = CONCAT44((int)((ulong)local_1250 >> 0x20),uVar31);
                lVar34 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar144 = local_1178[lVar34];
                  fVar72 = local_1168[lVar34];
                  uVar31 = *(undefined4 *)(local_1148 + lVar34 * 4);
                  uVar5 = *(undefined4 *)(local_1138 + lVar34 * 4);
                  uVar6 = *(undefined4 *)(local_1128 + lVar34 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + lVar34 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar31;
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar5;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar6;
                  *(float *)(ray + k * 4 + 0xf0) = fVar144;
                  *(float *)(ray + k * 4 + 0x100) = fVar72;
                  *(undefined4 *)(ray + k * 4 + 0x110) = uVar7;
                  *(uint *)(ray + k * 4 + 0x120) = uVar74;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_1288 = CONCAT44(uVar74,uVar74);
                  local_12c8 = CONCAT44(uVar7,uVar7);
                  auVar94 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar21);
                  uStack_12dc = (undefined4)
                                ((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar21 + 8) >> 0x20);
                  local_1248 = uVar27;
                  local_1240 = (ulong)uVar20;
                  fStack_121c = fStack_1220;
                  _local_1118 = auVar100;
                  while( true ) {
                    local_1088 = local_1178[lVar34];
                    fVar144 = local_1168[lVar34];
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1158 + lVar34 * 4);
                    args.context = context->user;
                    local_1078._4_4_ = fVar144;
                    local_1078._0_4_ = fVar144;
                    local_1078._8_4_ = fVar144;
                    local_1078._12_4_ = fVar144;
                    local_10b8 = *(undefined4 *)(local_1148 + lVar34 * 4);
                    uVar31 = *(undefined4 *)(local_1138 + lVar34 * 4);
                    uVar5 = *(undefined4 *)(local_1128 + lVar34 * 4);
                    local_10a8._4_4_ = uVar31;
                    local_10a8._0_4_ = uVar31;
                    local_10a8._8_4_ = uVar31;
                    local_10a8._12_4_ = uVar31;
                    local_1098._4_4_ = uVar5;
                    local_1098._0_4_ = uVar5;
                    local_1098._8_4_ = uVar5;
                    local_1098._12_4_ = uVar5;
                    uStack_10b4 = local_10b8;
                    uStack_10b0 = local_10b8;
                    uStack_10ac = local_10b8;
                    fStack_1084 = local_1088;
                    fStack_1080 = local_1088;
                    fStack_107c = local_1088;
                    local_1068 = local_12c8;
                    uStack_1060 = CONCAT44(uVar7,uVar7);
                    local_1058 = local_1288;
                    uStack_1050 = CONCAT44(uVar74,uVar74);
                    local_1048 = (args.context)->instID[0];
                    uStack_1044 = local_1048;
                    uStack_1040 = local_1048;
                    uStack_103c = local_1048;
                    local_1038 = (args.context)->instPrimID[0];
                    uStack_1034 = local_1038;
                    uStack_1030 = local_1038;
                    uStack_102c = local_1038;
                    local_1268._12_4_ = uStack_12dc;
                    local_1268._0_12_ = auVar94;
                    args.valid = (int *)local_1268;
                    args.geometryUserPtr = pGVar10->userPtr;
                    args.hit = (RTCHitN *)&local_10b8;
                    args.N = 4;
                    pRVar24 = (RTCRayN *)pGVar10->intersectionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (pRVar24 != (RTCRayN *)0x0) {
                      pRVar24 = (RTCRayN *)(*(code *)pRVar24)(&args);
                    }
                    if (local_1268 == (undefined1  [16])0x0) {
                      auVar87._8_4_ = 0xffffffff;
                      auVar87._0_8_ = 0xffffffffffffffff;
                      auVar87._12_4_ = 0xffffffff;
                      auVar87 = auVar87 ^ _DAT_01f46b70;
                    }
                    else {
                      pRVar24 = (RTCRayN *)context->args->filter;
                      if ((pRVar24 != (RTCRayN *)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar24 = (RTCRayN *)(*(code *)pRVar24)(&args);
                      }
                      auVar69._0_4_ = -(uint)(local_1268._0_4_ == 0);
                      auVar69._4_4_ = -(uint)(local_1268._4_4_ == 0);
                      auVar69._8_4_ = -(uint)(local_1268._8_4_ == 0);
                      auVar69._12_4_ = -(uint)(local_1268._12_4_ == 0);
                      auVar87 = auVar69 ^ _DAT_01f46b70;
                      if (local_1268 != (undefined1  [16])0x0) {
                        auVar100 = blendvps(*(undefined1 (*) [16])args.hit,
                                            *(undefined1 (*) [16])(args.ray + 0xc0),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0xc0) = auVar100;
                        auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                            *(undefined1 (*) [16])(args.ray + 0xd0),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0xd0) = auVar100;
                        auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                            *(undefined1 (*) [16])(args.ray + 0xe0),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0xe0) = auVar100;
                        auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                            *(undefined1 (*) [16])(args.ray + 0xf0),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0xf0) = auVar100;
                        auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                            *(undefined1 (*) [16])(args.ray + 0x100),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0x100) = auVar100;
                        auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                            *(undefined1 (*) [16])(args.ray + 0x110),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0x110) = auVar100;
                        auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                            *(undefined1 (*) [16])(args.ray + 0x120),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0x120) = auVar100;
                        auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                            *(undefined1 (*) [16])(args.ray + 0x130),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0x130) = auVar100;
                        auVar100 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                            *(undefined1 (*) [16])(args.ray + 0x140),auVar69);
                        *(undefined1 (*) [16])(args.ray + 0x140) = auVar100;
                        pRVar24 = args.ray;
                      }
                    }
                    if ((_DAT_01f46b40 & auVar87) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar72;
                    }
                    else {
                      fVar72 = *(float *)(ray + k * 4 + 0x80);
                    }
                    *(undefined4 *)(local_1268 + lVar34 * 4 + -0x10) = 0;
                    valid.field_0.i[0] = -(uint)(auVar185._0_4_ <= fVar72) & valid.field_0.i[0];
                    valid.field_0.i[1] = -(uint)(auVar185._4_4_ <= fVar72) & valid.field_0.i[1];
                    valid.field_0.i[2] = -(uint)(auVar185._8_4_ <= fVar72) & valid.field_0.i[2];
                    valid.field_0.i[3] = -(uint)(auVar185._12_4_ <= fVar72) & valid.field_0.i[3];
                    iVar25 = movmskps((int)pRVar24,(undefined1  [16])valid.field_0);
                    if (iVar25 == 0) break;
                    auVar180 = blendvps(_DAT_01f45a30,auVar185,(undefined1  [16])valid.field_0);
                    auVar126._4_4_ = auVar180._0_4_;
                    auVar126._0_4_ = auVar180._4_4_;
                    auVar126._8_4_ = auVar180._12_4_;
                    auVar126._12_4_ = auVar180._8_4_;
                    auVar100 = minps(auVar126,auVar180);
                    auVar88._0_8_ = auVar100._8_8_;
                    auVar88._8_4_ = auVar100._0_4_;
                    auVar88._12_4_ = auVar100._4_4_;
                    auVar100 = minps(auVar88,auVar100);
                    auVar89._0_8_ =
                         CONCAT44(-(uint)(auVar100._4_4_ == auVar180._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar100._0_4_ == auVar180._0_4_) & valid.field_0.i[0]);
                    auVar89._8_4_ = -(uint)(auVar100._8_4_ == auVar180._8_4_) & valid.field_0.i[2];
                    auVar89._12_4_ =
                         -(uint)(auVar100._12_4_ == auVar180._12_4_) & valid.field_0.i[3];
                    iVar25 = movmskps(iVar25,auVar89);
                    aVar70 = valid.field_0;
                    if (iVar25 != 0) {
                      aVar70.i[2] = auVar89._8_4_;
                      aVar70._0_8_ = auVar89._0_8_;
                      aVar70.i[3] = auVar89._12_4_;
                    }
                    uVar31 = movmskps(iVar25,(undefined1  [16])aVar70);
                    uVar27 = CONCAT44((int)((ulong)pRVar24 >> 0x20),uVar31);
                    lVar34 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> lVar34 & 1) == 0; lVar34 = lVar34 + 1) {
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar180._4_4_ = uVar7;
      auVar180._0_4_ = uVar7;
      auVar180._8_4_ = uVar7;
      auVar180._12_4_ = uVar7;
      auVar100 = local_10d8;
      fVar144 = local_fb8;
      fVar72 = fStack_fb4;
      fVar148 = fStack_fb0;
      fVar73 = fStack_fac;
      fVar105 = local_ff8;
      fVar154 = fStack_ff4;
      fVar155 = fStack_ff0;
      fVar109 = fStack_fec;
      fVar161 = local_1018;
      fVar190 = fStack_1014;
      fVar191 = fStack_1010;
      fVar167 = fStack_100c;
      fVar137 = local_1028;
      fVar93 = fStack_1024;
      fVar92 = fStack_1020;
      fVar187 = fStack_101c;
      fVar42 = local_10c8;
      fVar71 = fStack_10c4;
      fVar91 = fStack_10c0;
      fVar106 = fStack_10bc;
      fVar107 = local_fc8;
      fVar108 = fStack_fc4;
      fVar110 = fStack_fc0;
      fVar138 = fStack_fbc;
      fVar139 = local_fd8;
      fVar145 = fStack_fd4;
      fVar146 = fStack_fd0;
      fVar147 = fStack_fcc;
      fVar149 = local_fe8;
      fVar152 = fStack_fe4;
      fVar153 = fStack_fe0;
      fVar156 = fStack_fdc;
      fVar157 = local_1008;
      fVar158 = fStack_1004;
      fVar162 = fStack_1000;
      fVar163 = fStack_ffc;
    }
    else {
      pGVar30 = (GridSOA *)((ulong)pSVar26 & 0xfffffffffffffff0);
      sVar13 = *(size_t *)(pGVar30 + (ulong)*(uint *)(pGVar30 + 0x2c) + 0x30);
      (local_1258->super_Precalculations).grid = pGVar30;
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar180._4_4_ = uVar7;
      auVar180._0_4_ = uVar7;
      auVar180._8_4_ = uVar7;
      auVar180._12_4_ = uVar7;
      if (sVar13 != 0) {
        (pSVar33->ptr).ptr = sVar13;
        pSVar33->dist = 0;
        pSVar33 = pSVar33 + 1;
      }
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }